

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

int Sdb_StoDiffExactlyOne(Vec_Wec_t *vCuts,int Limit,int *pCut)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int local_3c;
  int local_38;
  int iNew;
  int k;
  int i;
  Vec_Int_t *vCut;
  int *pCut_local;
  int Limit_local;
  Vec_Wec_t *vCuts_local;
  
  for (iNew = 0; iVar1 = Vec_WecSize(vCuts), iNew < iVar1; iNew = iNew + 1) {
    pVVar2 = Vec_WecEntry(vCuts,iNew);
    local_38 = 1;
    while ((local_38 <= *pCut && (iVar1 = Vec_IntFind(pVVar2,pCut[local_38]), iVar1 != -1))) {
      local_38 = local_38 + 1;
    }
    if (local_38 == *pCut + 1) {
      return -1;
    }
  }
  iNew = 0;
  do {
    iVar1 = Vec_WecSize(vCuts);
    if ((iVar1 <= iNew) || (pVVar2 = Vec_WecEntry(vCuts,iNew), iNew == Limit)) {
      return -1;
    }
    local_3c = -1;
    for (local_38 = 1; local_38 <= *pCut; local_38 = local_38 + 1) {
      iVar1 = Vec_IntFind(pVVar2,pCut[local_38]);
      if (iVar1 < 0) {
        if (local_3c != -1) break;
        local_3c = pCut[local_38];
      }
    }
    if ((local_38 == *pCut + 1) && (local_3c != -1)) {
      return local_3c;
    }
    iNew = iNew + 1;
  } while( true );
}

Assistant:

int Sdb_StoDiffExactlyOne( Vec_Wec_t * vCuts, int Limit, int * pCut )
{
    Vec_Int_t * vCut;  
    int i, k, iNew;
    // check if it is fully contained in any one
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        for ( k = 1; k <= pCut[0]; k++ )
            if ( Vec_IntFind(vCut, pCut[k]) == -1 )
                break;
        if ( k == pCut[0] + 1 )
            return -1;
    }
    // check if there is one different
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        if ( i == Limit )
            break;
        for ( iNew = -1, k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
            return iNew;
    }
    return -1;
}